

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O0

unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> __thiscall
lsim::ModelCircuit::instantiate(ModelCircuit *this,Simulator *sim,bool top_level)

{
  bool bVar1;
  ComponentType CVar2;
  reference ppVar3;
  pointer comp_00;
  SimComponent *this_00;
  pointer ppVar4;
  mapped_type *ppMVar5;
  pointer *this_01;
  reference ppVar6;
  pointer pSVar7;
  pointer wire_00;
  byte in_CL;
  undefined7 in_register_00000011;
  pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>
  *wire;
  iterator __end1_1;
  iterator __begin1_1;
  wire_lut_t *__range1_1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>,_true>
  local_e0;
  iterator found;
  string name;
  SimComponent *sim_comp;
  pointer comp;
  pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>
  *comp_it;
  iterator __end1;
  iterator __begin1;
  component_lut_t *__range1;
  anon_class_8_1_0902ba13 connect_vias;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
  via_lut;
  undefined1 local_30 [8];
  __single_object instance;
  __node_base _Stack_20;
  bool top_level_local;
  Simulator *sim_local;
  ModelCircuit *this_local;
  
  _Stack_20._M_nxt = (_Hash_node_base *)CONCAT71(in_register_00000011,top_level);
  instance._M_t.super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>._M_t
  .super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>.
  super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl._7_1_ = in_CL & 1;
  sim_local = sim;
  this_local = this;
  std::make_unique<lsim::SimCircuit,lsim::Simulator*&,lsim::ModelCircuit*>
            ((Simulator **)local_30,(ModelCircuit **)&stack0xffffffffffffffe0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
                   *)&connect_vias);
  __range1 = (component_lut_t *)local_30;
  __end1 = std::
           unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>_>
           ::begin((unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>_>
                    *)&sim->m_init_components);
  comp_it = (pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>
             *)std::
               unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>_>
               ::end((unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>_>
                      *)&sim->m_init_components);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_false>
                         *)&comp_it);
    if (!bVar1) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_false,_false>
             ::operator*(&__end1);
    comp_00 = std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::get
                        (&ppVar3->second);
    pSVar7 = std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::operator->
                       ((unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> *)
                        local_30);
    this_00 = SimCircuit::add_component(pSVar7,comp_00);
    CVar2 = ModelComponent::type(comp_00);
    if (CVar2 == 0x20) {
      ModelComponent::property_value_abi_cxx11_((string *)&found,comp_00,"name","via");
      local_e0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
                   *)&connect_vias,(key_type *)&found);
      __range1_1 = (wire_lut_t *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
                   ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
                          *)&connect_vias);
      bVar1 = std::__detail::operator!=
                        (&local_e0,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>,_true>
                          *)&__range1_1);
      if (bVar1) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>,_false,_true>
                               *)&local_e0);
        instantiate::anon_class_8_1_0902ba13::operator()
                  ((anon_class_8_1_0902ba13 *)&__range1,comp_00,ppVar4->second);
      }
      else {
        ppMVar5 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
                                *)&connect_vias,(key_type *)&found);
        *ppMVar5 = comp_00;
      }
      std::__cxx11::string::~string((string *)&found);
    }
    if ((instance._M_t.
         super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>._M_t.
         super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>.
         super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl._7_1_ & 1) != 0) {
      CVar2 = ModelComponent::type(comp_00);
      if (CVar2 == 1) {
        SimComponent::enable_user_values(this_00);
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_false,_false>
    ::operator++(&__end1);
  }
  this_01 = &(sim->m_dirty_components).
             super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  __end1_1 = std::
             unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
             ::begin((unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
                      *)this_01);
  wire = (pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>
          *)std::
            unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
            ::end((unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
                   *)this_01);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1_1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false>
                         *)&wire);
    if (!bVar1) break;
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false,_false>
             ::operator*(&__end1_1);
    pSVar7 = std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::operator->
                       ((unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> *)
                        local_30);
    wire_00 = std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>::get
                        (&ppVar6->second);
    SimCircuit::add_wire(pSVar7,wire_00);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false,_false>
    ::operator++(&__end1_1);
  }
  std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::unique_ptr
            ((unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> *)this,
             (unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> *)local_30);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
                    *)&connect_vias);
  std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::~unique_ptr
            ((unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> *)local_30);
  return (__uniq_ptr_data<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>,_true,_true>)
         (__uniq_ptr_data<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>,_true,_true>)this;
}

Assistant:

std::unique_ptr<SimCircuit> ModelCircuit::instantiate(Simulator *sim, bool top_level) {
    auto instance = std::make_unique<SimCircuit>(sim, this);
    std::unordered_map<std::string, ModelComponent *> via_lut;

    // helper function to connect all pins of two vias
    auto connect_vias = [&instance](ModelComponent *via_a, ModelComponent *via_b) {
        assert(via_a->num_inputs() == via_b->num_inputs());
        for (uint32_t i = 0u; i < via_a->num_inputs(); ++i) {
            instance->connect_pins(via_a->input_pin_id(i), via_b->input_pin_id(i));
        }
    };

    for (auto &comp_it : m_components) {
        auto comp = comp_it.second.get();
        auto sim_comp = instance->add_component(comp);

        if (comp->type() == COMPONENT_VIA) {
            auto name = comp->property_value("name", "via");
            auto found = via_lut.find(name);
            if (found != via_lut.end()) {
                connect_vias(comp, found->second);
            } else {
                via_lut[name] = comp;
            }
        }

        if (top_level && comp->type() == COMPONENT_CONNECTOR_IN) {
            sim_comp->enable_user_values();
        }
    }

    for (auto &wire : m_wires) {
        instance->add_wire(wire.second.get());
    }

    return std::move(instance);
}